

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests2.cpp
# Opt level: O2

void __thiscall
test::prod_test::iu_ProdTest_x_iutest_x_PeepA2_Test::Body(iu_ProdTest_x_iutest_x_PeepA2_Test *this)

{
  int *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
  *(undefined4 *)
   ((long)&DAT_003aa3e7 +
   iutest::detail::peep_tag<test::prod_test::iu_peep_tag_m_a<test::prod_test::ProdClass>>::value + 1
   ) = 2;
  local_1c8.m_message._M_dataplus._M_p._0_4_ = DAT_003aa3f4;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x316376,"s_prod_2.GetA()",(char *)&local_198,(int *)&local_1c8,
             in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests2.cpp"
               ,0x1f,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x316376,
             "(s_prod_2.*::iutest::detail::peep_tag< iu_peep_tag_m_a<ProdClass> >::value)",
             (char *)&local_198,
             (int *)((long)&DAT_003aa3e7 +
                    iutest::detail::
                    peep_tag<test::prod_test::iu_peep_tag_m_a<test::prod_test::ProdClass>>::value +
                    1),in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests2.cpp"
               ,0x21,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(ProdTest, PeepA2)
{
    IUTEST_PEEP_GET(s_prod_2, ProdClass, m_a) = 2;
    IUTEST_EXPECT_EQ(2, s_prod_2.GetA());

    IUTEST_EXPECT_EQ(2, IUTEST_PEEP_GET(s_prod_2, ProdClass, m_a));
}